

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

SURFACE_TRANSFORM
Diligent::VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)

{
  VkSurfaceTransformFlagBitsKHR VVar1;
  string msg;
  
  VVar1 = vkTransformFlag - VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if ((vkTransformFlag ^ VVar1) <= VVar1) {
    FormatString<char[38]>(&msg,(char (*) [38])"Only single transform bit is expected");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VkSurfaceTransformFlagToSurfaceTransform",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5e6);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR < VVar1) {
    if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;
    }
    else if (vkTransformFlag == VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_ROTATE_270;
    }
    else if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_HORIZONTAL_MIRROR;
    }
    else if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90;
    }
    else if (vkTransformFlag == VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180;
    }
    else if (vkTransformFlag == VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR) {
      vkTransformFlag = SURFACE_TRANSFORM_ROTATE_180;
    }
    else {
      FormatString<char[29]>(&msg,(char (*) [29])"Unexpected surface transform");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VkSurfaceTransformFlagToSurfaceTransform",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5f5);
      std::__cxx11::string::~string((string *)&msg);
      vkTransformFlag = SURFACE_TRANSFORM_IDENTITY;
    }
  }
  return vkTransformFlag;
}

Assistant:

SURFACE_TRANSFORM VkSurfaceTransformFlagToSurfaceTransform(VkSurfaceTransformFlagBitsKHR vkTransformFlag)
{
    VERIFY(IsPowerOfTwo(static_cast<Uint32>(vkTransformFlag)), "Only single transform bit is expected");

    // clang-format off
    switch (vkTransformFlag)
    {
        case VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR:                     return SURFACE_TRANSFORM_IDENTITY;
        case VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR:                    return SURFACE_TRANSFORM_ROTATE_90;
        case VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_180;
        case VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR:                   return SURFACE_TRANSFORM_ROTATE_270;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR:            return SURFACE_TRANSFORM_HORIZONTAL_MIRROR;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR:  return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180;
        case VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR: return SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;

        default:
            UNEXPECTED("Unexpected surface transform");
            return SURFACE_TRANSFORM_IDENTITY;
    }
    // clang-format on
}